

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void __thiscall
ASN1Test_StringByCustomNIDThreads_Test::TestBody(ASN1Test_StringByCustomNIDThreads_Test *this)

{
  allocator_type *paVar1;
  pointer ptVar2;
  pointer ptVar3;
  size_type sVar4;
  pointer ptVar5;
  thread *ptVar6;
  allocator_type *__a;
  anon_class_8_1_898f4446_for__M_head_impl *__args;
  anon_class_8_1_898f4447_for__M_head_impl *__args_00;
  anon_class_8_1_898f4447_for__M_head_impl *__args_01;
  thread *thread;
  char *pcVar7;
  thread local_70;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  AssertHelper local_48;
  size_type local_40;
  int nid2;
  int nid1;
  
  nid1 = OBJ_create("1.2.840.113554.4.1.72585.1002","custom OID 1002","custom OID 1002");
  local_70._M_id._M_thread = (id)((ulong)local_70._M_id._M_thread._4_4_ << 0x20);
  testing::internal::CmpHelperNE<int,int>((internal *)&threads,"0","nid1",(int *)&local_70,&nid1);
  if ((char)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x77c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    nid2 = OBJ_create("1.2.840.113554.4.1.72585.1003","custom OID 1003","custom OID 1003");
    local_70._M_id._M_thread = (id)((ulong)local_70._M_id._M_thread & 0xffffffff00000000);
    testing::internal::CmpHelperNE<int,int>((internal *)&threads,"0","nid2",(int *)&local_70,&nid2);
    if ((char)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70._M_id._M_thread = (id)(id)&nid1;
      sVar4 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar5 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                         (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                          sVar4);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,ASN1Test_StringByCustomNIDThreads_Test::TestBody()::__0>
                ((allocator_type *)((long)ptVar5 - (long)ptVar2),&local_70,__args);
      ptVar6 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar2,(thread *)0x0,ptVar5,(allocator<std::thread> *)&threads);
      __a = (allocator_type *)
            std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                      ((thread *)0x0,ptVar3,ptVar6 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar2,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar2 >> 3);
      paVar1 = (allocator_type *)(ptVar5 + sVar4);
      local_70._M_id._M_thread = (id)(id)&nid2;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar5;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)__a;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)paVar1;
      if (__a == paVar1) {
        sVar4 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&threads,1,"vector::_M_realloc_insert");
        ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar5 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            sVar4);
        local_40 = sVar4;
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,ASN1Test_StringByCustomNIDThreads_Test::TestBody()::__1>
                  ((allocator_type *)(((long)paVar1 - (long)ptVar2) + (long)ptVar5),&local_70,
                   __args_01);
        ptVar6 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar2,(thread *)__a,ptVar5,(allocator<std::thread> *)&threads);
        ptVar6 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           ((thread *)__a,ptVar3,ptVar6 + 1,(allocator<std::thread> *)&threads);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar2,
                   (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar2 >> 3);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar5 + local_40;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar5;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar6;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,ASN1Test_StringByCustomNIDThreads_Test::TestBody()::__1>
                  (__a,&local_70,__args_00);
        ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
        ptVar5 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar6;
      }
      for (; ptVar5 != ptVar6; ptVar5 = ptVar5 + 1) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      return;
    }
    testing::Message::Message((Message *)&local_70);
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->_M_id)._M_thread;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x77f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_70._M_id._M_thread != 0) {
    (**(code **)(*(long *)local_70._M_id._M_thread + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST(ASN1Test, StringByCustomNIDThreads) {
  // This test affects library-global state. We rely on nothing else in the test
  // suite using these OIDs.
  int nid1 = OBJ_create("1.2.840.113554.4.1.72585.1002", "custom OID 1002",
                        "custom OID 1002");
  ASSERT_NE(NID_undef, nid1);
  int nid2 = OBJ_create("1.2.840.113554.4.1.72585.1003", "custom OID 1003",
                        "custom OID 1003");
  ASSERT_NE(NID_undef, nid2);

  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(ASN1_STRING_TABLE_add(nid1, 5, 10, V_ASN1_PRINTABLESTRING,
                                      STABLE_NO_MASK));
    bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_set_by_NID(
        nullptr, reinterpret_cast<const uint8_t *>("12345"), 5, MBSTRING_UTF8,
        nid1));
    ASSERT_TRUE(str);
    EXPECT_EQ(V_ASN1_PRINTABLESTRING, ASN1_STRING_type(str.get()));
    EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                    ASN1_STRING_length(str.get())));
  });
  threads.emplace_back([&] {
    ASSERT_TRUE(ASN1_STRING_TABLE_add(nid2, 5, 10, V_ASN1_PRINTABLESTRING,
                                      STABLE_NO_MASK));
    bssl::UniquePtr<ASN1_STRING> str(ASN1_STRING_set_by_NID(
        nullptr, reinterpret_cast<const uint8_t *>("12345"), 5, MBSTRING_UTF8,
        nid2));
    ASSERT_TRUE(str);
    EXPECT_EQ(V_ASN1_PRINTABLESTRING, ASN1_STRING_type(str.get()));
    EXPECT_EQ(Bytes("12345"), Bytes(ASN1_STRING_get0_data(str.get()),
                                    ASN1_STRING_length(str.get())));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}